

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O3

void __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
::solver_random_inequalities_101coeff
          (solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  sparse_matrix<int> *this_00;
  uint uVar1;
  int iVar2;
  pointer pmVar3;
  pointer pfVar4;
  byte bVar5;
  bool bVar6;
  ulong uVar7;
  int *piVar8;
  int *piVar9;
  ulong uVar10;
  rc_data *prVar11;
  bound_factor *pbVar12;
  float *pfVar13;
  undefined8 extraout_RAX;
  ulong uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *pvVar19;
  pointer pfVar20;
  uint *puVar21;
  void *pvVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  
  this_00 = &this->ap;
  this->rng = rng_;
  pvVar19 = csts;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(this_00,csts,m_,n_);
  uVar14 = (ulong)(this->ap).m_rows_values.m_length << 2;
  piVar9 = (int *)operator_new__(uVar14);
  memset(piVar9,0,uVar14);
  (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar9;
  pmVar3 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar17 = (long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3;
  uVar10 = (long)*(pointer *)
                  ((long)&(pmVar3->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl + 8) -
           *(long *)&(pmVar3->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl >> 3;
  if (lVar17 != 0x28) {
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar28 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar29 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar30 = vpbroadcastq_avx512f();
    uVar10 = 0;
    auVar31 = vpbroadcastq_avx512f();
    do {
      auVar32 = vpbroadcastq_avx512f();
      auVar33 = vmovdqa64_avx512f(auVar30);
      vpmullq_avx512dq(auVar26,auVar28);
      uVar10 = uVar10 + 8;
      auVar26 = vpaddq_avx512f(auVar26,auVar29);
      auVar30 = vporq_avx512f(auVar32,auVar27);
      uVar7 = vpcmpuq_avx512f(auVar30,auVar31,2);
      auVar30 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)((long)&(pmVar3->elements).
                                                                                                      
                                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                                  ._M_impl + 8U) + (long)pvVar19));
      bVar5 = (byte)uVar7;
      auVar32._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar30._8_8_;
      auVar32._0_8_ = (ulong)(bVar5 & 1) * auVar30._0_8_;
      auVar32._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar30._16_8_;
      auVar32._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar30._24_8_;
      auVar32._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar30._32_8_;
      auVar32._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar30._40_8_;
      auVar32._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar30._48_8_;
      auVar32._56_8_ = (uVar7 >> 7) * auVar30._56_8_;
      auVar30 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(pvVar19->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data +
                                    (long)&(pmVar3->elements).
                                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                           ._M_impl));
      auVar34._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar30._8_8_;
      auVar34._0_8_ = (ulong)(bVar5 & 1) * auVar30._0_8_;
      auVar34._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar30._16_8_;
      auVar34._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar30._24_8_;
      auVar34._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar30._32_8_;
      auVar34._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar30._40_8_;
      auVar34._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar30._48_8_;
      auVar34._56_8_ = (uVar7 >> 7) * auVar30._56_8_;
      auVar30 = vpsubq_avx512f(auVar32,auVar34);
      auVar30 = vpsraq_avx512f(auVar30,3);
      auVar30 = vpmaxuq_avx512f(auVar33,auVar30);
    } while (((lVar17 >> 3) * -0x3333333333333333 + 6U & 0xfffffffffffffff8) != uVar10);
    auVar26 = vmovdqa64_avx512f(auVar30);
    auVar27._0_8_ = (ulong)(bVar5 & 1) * auVar26._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar33._0_8_;
    bVar6 = (bool)((byte)(uVar7 >> 1) & 1);
    auVar27._8_8_ = (ulong)bVar6 * auVar26._8_8_ | (ulong)!bVar6 * auVar33._8_8_;
    bVar6 = (bool)((byte)(uVar7 >> 2) & 1);
    auVar27._16_8_ = (ulong)bVar6 * auVar26._16_8_ | (ulong)!bVar6 * auVar33._16_8_;
    bVar6 = (bool)((byte)(uVar7 >> 3) & 1);
    auVar27._24_8_ = (ulong)bVar6 * auVar26._24_8_ | (ulong)!bVar6 * auVar33._24_8_;
    bVar6 = (bool)((byte)(uVar7 >> 4) & 1);
    auVar27._32_8_ = (ulong)bVar6 * auVar26._32_8_ | (ulong)!bVar6 * auVar33._32_8_;
    bVar6 = (bool)((byte)(uVar7 >> 5) & 1);
    auVar27._40_8_ = (ulong)bVar6 * auVar26._40_8_ | (ulong)!bVar6 * auVar33._40_8_;
    bVar6 = (bool)((byte)(uVar7 >> 6) & 1);
    auVar27._48_8_ = (ulong)bVar6 * auVar26._48_8_ | (ulong)!bVar6 * auVar33._48_8_;
    auVar27._56_8_ = (uVar7 >> 7) * auVar26._56_8_ | (ulong)!SUB81(uVar7 >> 7,0) * auVar33._56_8_;
    auVar25 = vextracti64x4_avx512f(auVar27,1);
    auVar26 = vpmaxuq_avx512f(auVar27,ZEXT3264(auVar25));
    auVar23 = vpmaxuq_avx512vl(auVar26._0_16_,auVar26._16_16_);
    auVar24 = vpshufd_avx(auVar23,0xee);
    auVar24 = vpmaxuq_avx512vl(auVar23,auVar24);
    uVar10 = auVar24._0_8_;
  }
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar10;
  uVar10 = SUB168(auVar24 * ZEXT816(0xc),0);
  if (SUB168(auVar24 * ZEXT816(0xc),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  prVar11 = (rc_data *)operator_new__(uVar10);
  memset(prVar11,0,uVar10);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_false>
  ._M_head_impl = prVar11;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (long)m_;
  uVar10 = SUB168(auVar23 * ZEXT816(0xc),0);
  if (SUB168(auVar23 * ZEXT816(0xc),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pbVar12 = (bound_factor *)operator_new__(uVar10);
  memset(pbVar12,0,uVar10);
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_false>
  ._M_head_impl = pbVar12;
  uVar10 = 0xffffffffffffffff;
  if (-1 < m_) {
    uVar10 = (long)m_ << 2;
  }
  pfVar13 = (float *)operator_new__(uVar10);
  memset(pfVar13,0,uVar10);
  (this->pi)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar13;
  pfVar13 = (float *)operator_new__(uVar14);
  pvVar22 = (void *)0x0;
  memset(pfVar13,0,uVar14);
  (this->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar13;
  this->c = c_;
  (this->dist)._M_param._M_p = 0.5;
  this->m = m_;
  this->n = n_;
  pmVar3 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = ((long)(csts->
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3 >> 3) *
           -0x3333333333333333;
  if ((int)uVar10 != 0) {
    uVar14 = 0;
    do {
      pfVar20 = *(pointer *)
                 &pmVar3[uVar14].elements.
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl;
      pfVar4 = *(pointer *)
                ((long)&pmVar3[uVar14].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar20 == pfVar4) {
        iVar18 = 0;
        iVar15 = 0;
      }
      else {
        iVar18 = 0;
        puVar21 = (uint *)(piVar9 + (int)pvVar22);
        iVar15 = 0;
        do {
          uVar1 = pfVar20->factor;
          this = (solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                  *)(ulong)uVar1;
          if ((uVar1 + 1 & 0xfffffffd) != 0) {
            itm::solver_random_inequalities_101coeff();
            goto LAB_0015b535;
          }
          *puVar21 = uVar1;
          piVar8 = &pfVar20->factor;
          uVar1 = (uint)(0 < *piVar8);
          this = (solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                  *)(ulong)uVar1;
          pfVar20 = pfVar20 + 1;
          puVar21 = puVar21 + 1;
          pvVar22 = (void *)(ulong)((int)pvVar22 + 1);
          iVar18 = iVar18 + uVar1;
          iVar15 = iVar15 + (uint)(*piVar8 < 1);
        } while (pfVar20 != pfVar4);
      }
      iVar2 = pmVar3[uVar14].min;
      if (iVar2 == pmVar3[uVar14].max) {
        pbVar12[uVar14].min = iVar2;
        pbVar12[uVar14].max = iVar2;
      }
      else {
        iVar16 = -iVar15;
        if (iVar2 != iVar16 && SBORROW4(iVar2,iVar16) == iVar2 + iVar15 < 0) {
          iVar16 = iVar2;
        }
        pbVar12[uVar14].min = iVar16;
        if (pmVar3[uVar14].max < iVar18) {
          iVar18 = pmVar3[uVar14].max;
        }
        pbVar12[uVar14].max = iVar18;
        if (iVar18 < iVar16) {
LAB_0015b535:
          itm::solver_random_inequalities_101coeff();
          operator_delete__(pvVar22);
          (this->pi)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl = (float *)0x0;
          pbVar12 = (this->b)._M_t.
                    super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor[]>_>
                    .
                    super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_false>
                    ._M_head_impl;
          if (pbVar12 != (bound_factor *)0x0) {
            operator_delete__(pbVar12);
          }
          (this->b)._M_t.
          super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_false>
          ._M_head_impl = (bound_factor *)0x0;
          prVar11 = (this->R)._M_t.
                    super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
                    .
                    super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_false>
                    ._M_head_impl;
          if (prVar11 != (rc_data *)0x0) {
            operator_delete__(prVar11);
          }
          (this->R)._M_t.
          super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_false>
          ._M_head_impl = (rc_data *)0x0;
          piVar9 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
          if (piVar9 != (int *)0x0) {
            operator_delete__(piVar9);
          }
          (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
          sparse_matrix<int>::~sparse_matrix(this_00);
          _Unwind_Resume(extraout_RAX);
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uVar10 & 0xffffffff));
  }
  return;
}

Assistant:

solver_random_inequalities_101coeff(
      random_engine& rng_,
      int m_,
      int n_,
      const cost_type& c_,
      const std::vector<merged_constraint>& csts)
      : rng(rng_)
      , ap(csts, m_, n_)
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , P(std::make_unique<Float[]>(ap.size()))
      , c(c_)
      , dist(0.5)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);
                A[id++] = cst.factor;

                if (cst.factor > 0)
                    upper++;
                else
                    lower++;
            }

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                b[i].min = std::max(-lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            bx_ensures(b[i].min <= b[i].max);
        }
    }